

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall amrex::BaseFab<char>::clear(BaseFab<char> *this)

{
  long in_RDI;
  char *unaff_retaddr;
  size_t in_stack_00000290;
  Long in_stack_00000298;
  Long in_stack_000002a0;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
      if ((*(byte *)(in_RDI + 0x41) & 1) != 0) {
        Abort_host(unaff_retaddr);
      }
      placementDelete<char>(*(char **)(in_RDI + 0x10),*(Long *)(in_RDI + 0x38));
      DataAllocator::free((DataAllocator *)(in_RDI + 8),*(void **)(in_RDI + 0x10));
      if (*(int *)(in_RDI + 0x34) < 2) {
        update_fab_stats(in_stack_000002a0,in_stack_00000298,in_stack_00000290);
      }
      else {
        update_fab_stats(in_stack_000002a0,in_stack_00000298,in_stack_00000290);
      }
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  return;
}

Assistant:

void
BaseFab<T>::clear () noexcept
{
    if (this->dptr)
    {
        //
        // Call T::~T() on the to-be-destroyed memory.
        //
        if (this->ptr_owner)
        {
            if (this->shared_memory)
            {
                amrex::Abort("BaseFab::clear: BaseFab cannot be owner of shared memory");
            }

            placementDelete(this->dptr, this->truesize);

            this->free(this->dptr);

            if (this->nvar > 1) {
                amrex::update_fab_stats(-this->truesize/this->nvar, -this->truesize, sizeof(T));
            } else {
                amrex::update_fab_stats(0, -this->truesize, sizeof(T));
            }
        }

        this->dptr = 0;
        this->truesize = 0;
    }
}